

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

AttributeSpec *
deqp::gls::DrawTestSpec::AttributeSpec::createDefaultAttribute
          (AttributeSpec *__return_storage_ptr__,InputType inputType,OutputType outputType,
          int componentCount)

{
  AttributeSpec *spec;
  int componentCount_local;
  OutputType outputType_local;
  InputType inputType_local;
  
  AttributeSpec(__return_storage_ptr__);
  __return_storage_ptr__->inputType = inputType;
  __return_storage_ptr__->outputType = outputType;
  __return_storage_ptr__->storage = STORAGE_LAST;
  __return_storage_ptr__->usage = USAGE_LAST;
  __return_storage_ptr__->componentCount = componentCount;
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->stride = 0;
  __return_storage_ptr__->normalize = false;
  __return_storage_ptr__->instanceDivisor = 0;
  __return_storage_ptr__->useDefaultAttribute = true;
  return __return_storage_ptr__;
}

Assistant:

DrawTestSpec::AttributeSpec	DrawTestSpec::AttributeSpec::createDefaultAttribute (InputType inputType, OutputType outputType, int componentCount)
{
	DE_ASSERT(inputType == INPUTTYPE_INT || inputType == INPUTTYPE_UNSIGNED_INT || inputType == INPUTTYPE_FLOAT);
	DE_ASSERT(inputType == INPUTTYPE_FLOAT || componentCount == 4);

	DrawTestSpec::AttributeSpec spec;

	spec.inputType				= inputType;
	spec.outputType				= outputType;
	spec.storage				= DrawTestSpec::STORAGE_LAST;
	spec.usage					= DrawTestSpec::USAGE_LAST;
	spec.componentCount			= componentCount;
	spec.offset					= 0;
	spec.stride					= 0;
	spec.normalize				= 0;
	spec.instanceDivisor		= 0;

	spec.useDefaultAttribute	= true;

	return spec;
}